

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSIMDExtract(BinaryInstWriter *this,SIMDExtract *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_3c;
  U32LEB local_38;
  U32LEB local_34;
  U32LEB local_30;
  U32LEB local_2c;
  U32LEB local_28;
  U32LEB local_24;
  U32LEB local_20;
  U32LEB local_1c;
  SIMDExtract *local_18;
  SIMDExtract *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (SIMDExtract *)this;
  BufferWithRandomAccess::operator<<(this->o,-3);
  switch(local_18->op) {
  case ExtractLaneSVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x15);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
    break;
  case ExtractLaneUVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x16);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
    break;
  case ExtractLaneSVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_24,0x18);
    BufferWithRandomAccess::operator<<(pBVar1,local_24);
    break;
  case ExtractLaneUVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_28,0x19);
    BufferWithRandomAccess::operator<<(pBVar1,local_28);
    break;
  case ExtractLaneVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,0x1b);
    BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    break;
  case ExtractLaneVecI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,0x1d);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
    break;
  case ExtractLaneVecF16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,0x121);
    BufferWithRandomAccess::operator<<(pBVar1,local_34);
    break;
  case ExtractLaneVecF32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_38,0x1f);
    BufferWithRandomAccess::operator<<(pBVar1,local_38);
    break;
  case ExtractLaneVecF64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_3c,0x21);
    BufferWithRandomAccess::operator<<(pBVar1,local_3c);
  }
  BufferWithRandomAccess::operator<<(this->o,local_18->index);
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDExtract(SIMDExtract* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ExtractLaneSVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ExtractLaneS);
      break;
    case ExtractLaneUVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ExtractLaneU);
      break;
    case ExtractLaneSVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ExtractLaneS);
      break;
    case ExtractLaneUVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ExtractLaneU);
      break;
    case ExtractLaneVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ExtractLane);
      break;
    case ExtractLaneVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ExtractLane);
      break;
    case ExtractLaneVecF16x8:
      o << U32LEB(BinaryConsts::F16x8ExtractLane);
      break;
    case ExtractLaneVecF32x4:
      o << U32LEB(BinaryConsts::F32x4ExtractLane);
      break;
    case ExtractLaneVecF64x2:
      o << U32LEB(BinaryConsts::F64x2ExtractLane);
      break;
  }
  o << uint8_t(curr->index);
}